

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O3

TValue * cploop_opt(lua_State *L,lua_CFunction dummy,void *ud)

{
  long lVar1;
  byte *pbVar2;
  ushort uVar3;
  long lVar4;
  bool bVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  TRef TVar9;
  undefined2 *p;
  ushort *puVar10;
  ulong uVar11;
  byte bVar12;
  ushort uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  byte bVar17;
  ushort uVar18;
  ushort *puVar19;
  undefined4 *puVar20;
  ushort *puVar21;
  MSize nsz;
  ulong uVar22;
  bool bVar23;
  undefined4 *puVar24;
  ulong uVar25;
  IRRef ref;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  uint uVar30;
  ushort *puVar31;
  undefined4 uVar32;
  IRRef1 phi [64];
  uint local_fc;
  ushort local_b8 [68];
  
  uVar14 = *(uint *)((long)ud + 8);
  uVar16 = (ulong)((*(lua_State **)((long)ud + 0x60))->glref).ptr32;
  uVar8 = uVar14 * 2 - 0x10000;
  p = *(undefined2 **)(uVar16 + 0x58);
  if (*(uint *)(uVar16 + 100) < uVar8) {
    nsz = 0x20;
    if (0x20 < uVar8) {
      nsz = uVar8;
    }
    p = (undefined2 *)lj_mem_realloc(*(lua_State **)((long)ud + 0x60),p,*(uint *)(uVar16 + 100),nsz)
    ;
    *(undefined2 **)(uVar16 + 0x58) = p;
    *(MSize *)(uVar16 + 100) = nsz;
  }
  *p = 0x8000;
  *(undefined2 *)((long)ud + 0x9c) = 0x1180;
  *(undefined4 *)((long)ud + 0x98) = 0;
  lj_ir_emit((jit_State *)ud);
  uVar3 = *(ushort *)((long)ud + 0x1c);
  uVar8 = (uint)uVar3 * 2 - 2;
  if (*(uint *)((long)ud + 0x114) < uVar8) {
    lj_snap_grow_buf_((jit_State *)ud,uVar8);
  }
  lVar15 = *(long *)((long)ud + 0x20);
  uVar16 = (ulong)(uVar3 - 1);
  uVar8 = (uint)*(byte *)(lVar15 + 6 + uVar16 * 8) * (uVar3 - 2) +
          (uint)*(ushort *)((long)ud + 0x1e) * 2;
  if (*(uint *)((long)ud + 0x128) < uVar8) {
    lj_snap_grow_map_((jit_State *)ud,uVar8);
    lVar15 = *(long *)((long)ud + 0x20);
  }
  lVar29 = (ulong)*(ushort *)(lVar15 + uVar16 * 8) * 4 + *(long *)((long)ud + 0x28);
  uVar16 = (ulong)*(byte *)(lVar15 + 6 + uVar16 * 8);
  *(undefined4 *)(lVar29 + uVar16 * 4) = 0xff000000;
  local_fc = 0;
  if (0x8001 < uVar14) {
    local_fc = 0;
    uVar22 = 0x8001;
    puVar21 = (ushort *)(lVar15 + 8);
    do {
      puVar31 = puVar21;
      if (puVar21[1] <= uVar22) {
        puVar31 = puVar21 + 4;
        uVar18 = *puVar21;
        puVar19 = (ushort *)
                  ((ulong)((uint)*(ushort *)((long)ud + 0x1c) * 8) + *(long *)((long)ud + 0x20));
        puVar10 = puVar31;
        if (puVar31 == puVar19) {
          puVar10 = (ushort *)((long)ud + 0x1e);
        }
        uVar13 = *puVar10;
        bVar17 = (byte)puVar21[3];
        uVar6 = puVar21[2];
        if (*(char *)((long)ud + 0x96) < '\0') {
          uVar7 = *(ushort *)((long)ud + 0x1e);
          *(ushort *)((long)ud + 0x1c) = *(ushort *)((long)ud + 0x1c) + 1;
        }
        else {
          uVar7 = puVar19[-4];
          puVar19 = puVar19 + -4;
        }
        lVar4 = *(long *)((long)ud + 0x28);
        lVar15 = lVar4 + (ulong)uVar18 * 4;
        uVar25 = 0;
        *(undefined1 *)((long)ud + 0x96) = 0;
        *puVar19 = uVar7;
        puVar19[1] = *(ushort *)((long)ud + 8);
        *(byte *)(puVar19 + 2) = (byte)uVar6;
        *(undefined1 *)((long)puVar19 + 5) = *(undefined1 *)((long)puVar21 + 5);
        *(undefined1 *)((long)puVar19 + 7) = 0;
        lVar1 = lVar4 + (ulong)uVar7 * 4;
        uVar28 = 0;
        if (bVar17 != 0) {
          uVar28 = 0;
          uVar25 = 0;
          uVar11 = 0;
          do {
            uVar8 = *(uint *)(lVar15 + uVar11 * 4);
            uVar26 = *(uint *)(lVar29 + uVar25 * 4);
            uVar27 = uVar26 >> 0x18;
            uVar30 = uVar8 >> 0x18;
            if (uVar27 < uVar30) {
              *(uint *)(lVar1 + uVar28 * 4) = uVar26;
              uVar26 = (int)uVar25 + 1;
            }
            else {
              if (0x7fff < (uVar8 & 0xffff)) {
                uVar8 = (uint)(ushort)p[(ulong)(uVar8 & 0xffff) - 0x8000] | uVar8 & 0xfffb0000;
              }
              uVar26 = (int)uVar25 + (uint)(uVar27 == uVar30);
              *(uint *)(lVar1 + uVar28 * 4) = uVar8;
              uVar11 = (ulong)((int)uVar11 + 1);
            }
            uVar25 = (ulong)uVar26;
            uVar28 = (ulong)((int)uVar28 + 1);
          } while ((uint)uVar11 < (uint)bVar17);
        }
        uVar27 = (uint)uVar28;
        uVar26 = (uint)uVar25;
        uVar8 = *(uint *)(lVar29 + uVar25 * 4);
        while (uVar8 >> 0x18 < (uint)(byte)uVar6) {
          uVar26 = uVar26 + 1;
          uVar27 = (int)uVar28 + 1;
          *(uint *)(lVar1 + uVar28 * 4) = uVar8;
          uVar28 = (ulong)uVar27;
          uVar8 = *(uint *)(lVar29 + (ulong)uVar26 * 4);
        }
        *(char *)(puVar19 + 3) = (char)uVar27;
        puVar20 = (undefined4 *)(lVar1 + (ulong)uVar27 * 4);
        for (puVar24 = (undefined4 *)(lVar15 + (ulong)(uint)bVar17 * 4);
            puVar24 < (undefined4 *)(lVar4 + (ulong)uVar13 * 4); puVar24 = puVar24 + 1) {
          *puVar20 = *puVar24;
          puVar20 = puVar20 + 1;
        }
        *(ushort *)((long)ud + 0x1e) = (ushort)((uint)((int)puVar20 - (int)lVar4) >> 2);
      }
      lVar15 = *(long *)((long)ud + 0x10);
      uVar18 = *(ushort *)(lVar15 + uVar22 * 8);
      uVar13 = uVar18;
      if ((short)uVar18 < 0) {
        uVar13 = p[(ulong)uVar18 - 0x8000];
      }
      uVar6 = *(ushort *)(lVar15 + 2 + uVar22 * 8);
      uVar7 = uVar6;
      if ((short)uVar6 < 0) {
        uVar7 = p[(ulong)uVar6 - 0x8000];
      }
      if ((((lj_ir_mode[*(byte *)(lVar15 + 5 + uVar22 * 8)] & 0x60) == 0) && (uVar13 == uVar18)) &&
         (uVar7 == uVar6)) {
        p[uVar22 - 0x8000] = (short)uVar22;
      }
      else {
        bVar17 = *(byte *)(lVar15 + 4 + uVar22 * 8);
        *(ushort *)((long)ud + 0x9c) = *(ushort *)(lVar15 + 4 + uVar22 * 8) & 0xffbf;
        *(ushort *)((long)ud + 0x98) = uVar13;
        *(ushort *)((long)ud + 0x9a) = uVar7;
        TVar9 = lj_opt_fold((jit_State *)ud);
        uVar8 = TVar9 & 0xffff;
        uVar28 = (ulong)uVar8;
        uVar18 = (ushort)TVar9;
        p[uVar22 - 0x8000] = uVar18;
        if (uVar22 != uVar28) {
          lVar15 = *(long *)((long)ud + 0x10);
          if (uVar8 < uVar14) {
            bVar12 = *(byte *)(lVar15 + 4 + uVar28 * 8);
            if ((0x7fff < uVar8) && (2 < (bVar12 & 0x1f) && (char)((bVar12 & 0x40) >> 6) == '\0')) {
              bVar12 = bVar12 | 0x40;
              *(byte *)(lVar15 + 4 + uVar28 * 8) = bVar12;
              if (0x3f < local_fc) {
LAB_0013c365:
                lj_trace_err((jit_State *)ud,LJ_TRERR_PHIOV);
              }
              uVar28 = (ulong)local_fc;
              local_fc = local_fc + 1;
              local_b8[uVar28] = uVar18;
            }
            if (((bVar12 ^ bVar17) & 0x1f) != 0) {
              uVar8 = bVar17 & 0x1f;
              if (uVar8 - 0x14 < 0xfffffffb) {
                if ((uVar8 != 0xe) || (uVar32 = 0x550e01d3, 4 < (bVar12 & 0x1f) - 0xf)) {
LAB_0013c372:
                  lj_trace_err((jit_State *)ud,LJ_TRERR_TYPEINS);
                }
              }
              else {
                if ((bVar12 & 0x1f) - 0xf < 5) goto LAB_0013be9f;
                uVar32 = 0x5593326e;
                if ((bVar12 & 0x1f) != 0xe) goto LAB_0013c372;
              }
              *(ushort *)((long)ud + 0x98) = uVar18;
              *(undefined4 *)((long)ud + 0x9a) = uVar32;
              TVar9 = lj_opt_fold((jit_State *)ud);
              uVar8 = TVar9 & 0xffff;
              p[uVar22 - 0x8000] = (short)TVar9;
              lVar15 = (ulong)(uVar8 * 8) + *(long *)((long)ud + 0x10);
LAB_0013bfd4:
              if ((0x7fff < uVar8 && uVar8 < uVar14) && ((*(byte *)(lVar15 + 4) & 0x40) == 0)) {
                *(byte *)(lVar15 + 4) = *(byte *)(lVar15 + 4) | 0x40;
                if (0x3f < local_fc) goto LAB_0013c365;
                uVar28 = (ulong)local_fc;
                local_fc = local_fc + 1;
                local_b8[uVar28] = (ushort)uVar8;
              }
            }
          }
          else if (((uVar8 != 0xffff) && (uVar14 < uVar8)) &&
                  (*(char *)(lVar15 + 5 + uVar28 * 8) == 'U')) {
            uVar18 = *(ushort *)(lVar15 + uVar28 * 8);
            uVar8 = (uint)uVar18;
            if (uVar18 < uVar14) {
              lVar15 = lVar15 + (ulong)uVar18 * 8;
              goto LAB_0013bfd4;
            }
          }
        }
      }
LAB_0013be9f:
      uVar22 = uVar22 + 1;
      puVar21 = puVar31;
    } while (uVar22 != uVar14);
  }
  if (-1 < *(char *)((long)ud + 0x96)) {
    uVar14 = *(int *)((long)ud + 0x1c) - 1;
    *(short *)((long)ud + 0x1c) = (short)uVar14;
    *(undefined2 *)((long)ud + 0x1e) =
         *(undefined2 *)(*(long *)((long)ud + 0x20) + (ulong)(uVar14 & 0xffff) * 8);
  }
  *(undefined4 *)(lVar29 + uVar16 * 4) =
       *(undefined4 *)
        (*(long *)((long)ud + 0x28) + (ulong)*(byte *)(*(long *)((long)ud + 0x20) + 6) * 4);
  uVar18 = *(ushort *)((long)ud + 0x162);
  if (local_fc == 0) {
    uVar16 = 0;
    bVar5 = true;
  }
  else {
    bVar23 = true;
    uVar16 = 0;
    uVar22 = 0;
    do {
      while( true ) {
        uVar28 = uVar22 + 1;
        uVar13 = local_b8[uVar22];
        uVar25 = (ulong)uVar13;
        uVar6 = p[uVar25 - 0x8000];
        uVar22 = uVar28;
        if ((uVar13 != uVar6) && (uVar6 != 0xffff)) break;
        pbVar2 = (byte *)(*(long *)((long)ud + 0x10) + 4 + uVar25 * 8);
        *pbVar2 = *pbVar2 & 0xbf;
LAB_0013c0c9:
        if (uVar28 == local_fc) {
          bVar5 = true;
          uVar11 = uVar16;
          if (bVar23) goto LAB_0013c1d7;
          goto LAB_0013c0f9;
        }
      }
      uVar11 = (ulong)((int)uVar16 + 1);
      local_b8[uVar16] = uVar13;
      lVar15 = *(long *)((long)ud + 0x10);
      uVar16 = uVar11;
      if ((*(ushort *)(lVar15 + (ulong)uVar6 * 8) == uVar13) ||
         (*(ushort *)(lVar15 + 2 + (ulong)uVar6 * 8) == uVar13)) goto LAB_0013c0c9;
      pbVar2 = (byte *)(lVar15 + 4 + uVar25 * 8);
      *pbVar2 = *pbVar2 | 0x20;
      bVar23 = false;
    } while (uVar28 != local_fc);
LAB_0013c0f9:
    uVar14 = *(int *)((long)ud + 8) - 1;
    if (uVar18 < uVar14) {
      uVar16 = (ulong)uVar14;
      do {
        lVar15 = *(long *)((long)ud + 0x10);
        uVar13 = *(ushort *)(lVar15 + 2 + uVar16 * 8);
        if ((short)uVar13 < 0) {
          pbVar2 = (byte *)(lVar15 + 4 + (ulong)uVar13 * 8);
          *pbVar2 = *pbVar2 & 0xdf;
        }
        uVar13 = *(ushort *)(lVar15 + uVar16 * 8);
        if ((short)uVar13 < 0) {
          pbVar2 = (byte *)(*(long *)((long)ud + 0x10) + 4 + (ulong)uVar13 * 8);
          *pbVar2 = *pbVar2 & 0xdf;
          uVar13 = *(ushort *)(lVar15 + uVar16 * 8);
          if (((uVar13 < uVar18) && ((byte)(*(char *)(lVar15 + 5 + uVar16 * 8) + 0xa7U) < 5)) &&
             (*(char *)(*(long *)((long)ud + 0x10) + 5 + (ulong)uVar13 * 8) == ']')) {
            puVar21 = (ushort *)(*(long *)((long)ud + 0x10) + (ulong)uVar13 * 8);
            do {
              if ((short)puVar21[1] < 0) {
                pbVar2 = (byte *)(*(long *)((long)ud + 0x10) + 4 + (ulong)puVar21[1] * 8);
                *pbVar2 = *pbVar2 & 0xdf;
              }
              if (-1 < (short)*puVar21) break;
              puVar21 = (ushort *)(*(long *)((long)ud + 0x10) + (ulong)*puVar21 * 8);
              *(byte *)(puVar21 + 2) = (byte)puVar21[2] & 0xdf;
            } while (*(char *)((long)puVar21 + 5) == ']');
          }
        }
        uVar16 = uVar16 - 1;
      } while ((uint)uVar18 < (uint)uVar16);
    }
    uVar14 = (uint)*(ushort *)((long)ud + 0x1c);
    while (uVar14 = uVar14 - 1, uVar3 <= uVar14) {
      uVar16 = (ulong)*(byte *)(*(long *)((long)ud + 0x20) + 6 + (ulong)uVar14 * 8);
      if (uVar16 != 0) {
        uVar13 = *(ushort *)(*(long *)((long)ud + 0x20) + (ulong)uVar14 * 8);
        lVar15 = *(long *)((long)ud + 0x28);
        uVar22 = 0;
        do {
          uVar6 = *(ushort *)((ulong)uVar13 * 4 + lVar15 + uVar22 * 4);
          if (0x7fff < uVar6) {
            pbVar2 = (byte *)(*(long *)((long)ud + 0x10) + 4 + (ulong)uVar6 * 8);
            *pbVar2 = *pbVar2 & 0xdf;
          }
          uVar22 = uVar22 + 1;
        } while (uVar16 != uVar22);
      }
    }
    bVar5 = false;
    uVar16 = uVar11;
  }
LAB_0013c1d7:
  uVar14 = *(int *)((long)ud + 0x8c) + *(int *)((long)ud + 0x90);
  if (1 < uVar14) {
    uVar22 = 1;
    do {
      uVar3 = *(ushort *)((long)ud + uVar22 * 4 + 0x1fc);
      uVar16 = uVar16 & 0xffffffff;
      while ((uVar8 = (uint)uVar3, 0x7fff < uVar8 &&
             (uVar28 = (ulong)uVar8, uVar8 != (ushort)p[uVar28 - 0x8000]))) {
        lVar15 = *(long *)((long)ud + 0x10);
        bVar17 = *(byte *)(lVar15 + 4 + uVar28 * 8);
        *(byte *)(lVar15 + 4 + uVar28 * 8) = bVar17 & 0xdf;
        if (((bVar17 & 0x40) != 0) || ((bVar17 & 0x1f) < 3)) break;
        *(byte *)(lVar15 + 4 + uVar28 * 8) = bVar17 & 0xdf | 0x40;
        if (0x3f < uVar16) goto LAB_0013c365;
        local_b8[uVar16] = uVar3;
        uVar16 = uVar16 + 1;
        uVar3 = p[uVar28 - 0x8000];
        if (uVar18 < uVar3) break;
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != uVar14);
  }
  if (!bVar5) {
    if ((int)uVar16 == 0) {
      return (TValue *)0x0;
    }
    uVar22 = 0;
    bVar23 = false;
    do {
      do {
        bVar5 = bVar23;
        lVar15 = *(long *)((long)ud + 0x10);
        if ((*(byte *)(lVar15 + 4 + (ulong)local_b8[uVar22] * 8) & 0x20) == 0) {
          bVar17 = *(byte *)(lVar15 + 4 + (ulong)(ushort)p[(ulong)local_b8[uVar22] - 0x8000] * 8);
          if ((bVar17 & 0x20) != 0) {
            *(byte *)(lVar15 + 4 + (ulong)(ushort)p[(ulong)local_b8[uVar22] - 0x8000] * 8) =
                 bVar17 & 0xdf;
            bVar5 = true;
          }
        }
        uVar22 = uVar22 + 1;
        bVar23 = bVar5;
      } while (uVar22 != (uVar16 & 0xffffffff));
      uVar22 = 0;
      bVar23 = false;
    } while (bVar5);
  }
  if ((int)uVar16 != 0) {
    uVar22 = 0;
    do {
      uVar3 = local_b8[uVar22];
      uVar28 = (ulong)uVar3;
      lVar15 = *(long *)((long)ud + 0x10);
      bVar17 = *(byte *)(lVar15 + 4 + uVar28 * 8);
      if ((bVar17 & 0x20) == 0) {
        uVar13 = p[uVar28 - 0x8000];
        if (uVar18 < uVar13) {
          pbVar2 = (byte *)(lVar15 + 4 + (ulong)uVar13 * 8);
          *pbVar2 = *pbVar2 | 0x40;
          bVar17 = *(byte *)(lVar15 + 4 + uVar28 * 8);
        }
        *(ushort *)((long)ud + 0x9c) = bVar17 & 0x1f | 0x1300;
        *(ushort *)((long)ud + 0x98) = uVar3;
        *(ushort *)((long)ud + 0x9a) = uVar13;
        lj_ir_emit((jit_State *)ud);
      }
      else {
        *(byte *)(lVar15 + 4 + uVar28 * 8) = bVar17 & 0x9f;
      }
      uVar22 = uVar22 + 1;
    } while ((uVar16 & 0xffffffff) != uVar22);
  }
  return (TValue *)0x0;
}

Assistant:

static TValue *cploop_opt(lua_State *L, lua_CFunction dummy, void *ud)
{
  UNUSED(L); UNUSED(dummy);
  loop_unroll((jit_State *)ud);
  return NULL;
}